

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdrloader.cpp
# Opt level: O0

bool HDRLoader::load(char *fileName,HDRLoaderResult *res)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  RGBE *scanline_00;
  RGBE *scan;
  int *in_RSI;
  char *in_RDI;
  int y;
  RGBE *scanline;
  float *cols;
  int h;
  int w;
  char reso [200];
  char oldc;
  char c;
  char cmd [200];
  FILE *file;
  char str [200];
  int i;
  float *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  int local_290;
  int local_28c;
  char local_288 [206];
  char local_1ba;
  char local_1b9;
  char acStack_1b8 [200];
  FILE *local_f0;
  undefined1 local_e8 [204];
  int local_1c;
  int *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_f0 = fopen(in_RDI,"rb");
  if (local_f0 == (FILE *)0x0) {
    local_1 = false;
  }
  else {
    fread(local_e8,10,1,local_f0);
    iVar4 = memcmp(local_e8,"#?RADIANCE",10);
    if (iVar4 == 0) {
      fseek(local_f0,1,1);
      local_1c = 0;
      local_1b9 = '\0';
      while( true ) {
        local_1ba = local_1b9;
        iVar4 = fgetc(local_f0);
        local_1b9 = (char)iVar4;
        if ((local_1b9 == '\n') && (local_1ba == '\n')) break;
        lVar5 = (long)local_1c;
        local_1c = local_1c + 1;
        acStack_1b8[lVar5] = local_1b9;
      }
      local_1c = 0;
      local_1b9 = '\n';
      do {
        iVar4 = fgetc(local_f0);
        local_1b9 = (char)iVar4;
        lVar5 = (long)local_1c;
        local_1c = local_1c + 1;
        local_288[lVar5] = local_1b9;
      } while (local_1b9 != '\n');
      iVar4 = __isoc99_sscanf(local_288,"-Y %d +X %d",&local_290,&local_28c);
      if (iVar4 == 0) {
        fclose(local_f0);
        local_1 = false;
      }
      else {
        *local_18 = local_28c;
        local_18[1] = local_290;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(local_28c * local_290 * 3);
        uVar6 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        scanline_00 = (RGBE *)operator_new__(uVar6);
        *(RGBE **)(local_18 + 2) = scanline_00;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)local_28c;
        uVar6 = SUB168(auVar2 * ZEXT816(4),0);
        if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        scan = (RGBE *)operator_new__(uVar6);
        if (scan == (RGBE *)0x0) {
          fclose(local_f0);
          local_1 = false;
        }
        else {
          while ((iVar4 = local_290 + -1, -1 < iVar4 &&
                 (bVar3 = decrunch(scanline_00,(int)((ulong)scan >> 0x20),
                                   (FILE *)CONCAT44(iVar4,in_stack_fffffffffffffd58)), bVar3))) {
            workOnRGBE(scan,iVar4,in_stack_fffffffffffffd50);
            scanline_00 = scanline_00 + local_28c * 3;
            local_290 = iVar4;
          }
          if (scan != (RGBE *)0x0) {
            operator_delete__(scan);
          }
          fclose(local_f0);
          local_1 = true;
        }
      }
    }
    else {
      fclose(local_f0);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool HDRLoader::load(const char *fileName, HDRLoaderResult &res)
{
	int i;
	char str[200];
	FILE *file;

	file = fopen(fileName, "rb");
	if (!file)
		return false;

	fread(str, 10, 1, file);
	if (memcmp(str, "#?RADIANCE", 10)) {
		fclose(file);
		return false;
	}

	fseek(file, 1, SEEK_CUR);

	char cmd[200];
	i = 0;
	char c = 0, oldc;
	while(true) {
		oldc = c;
		c = fgetc(file);
		if (c == 0xa && oldc == 0xa)
			break;
		cmd[i++] = c;
	}

	char reso[200];
	i = 0;
	while(true) {
		c = fgetc(file);
		reso[i++] = c;
		if (c == 0xa)
			break;
	}

	int w, h;
	if (!sscanf(reso, "-Y %d +X %d", &h, &w)) {
		fclose(file);
		return false;
	}

	res.width = w;
	res.height = h;

	float *cols = new float[w * h * 3];
	res.cols = cols;

	RGBE *scanline = new RGBE[w];
	if (!scanline) {
		fclose(file);
		return false;
	}

	// convert image 
	for (int y = h - 1; y >= 0; y--) {
		if (decrunch(scanline, w, file) == false)
			break;
		workOnRGBE(scanline, w, cols);
		cols += w * 3;
	}

	delete [] scanline;
	fclose(file);

	return true;
}